

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

SC_Man * Abc_SclManStart(SC_Lib *pLib,Abc_Ntk_t *pNtk,int fUseWireLoads,int fDept,float DUser,
                        int nTreeCRatio)

{
  SC_Man *p_00;
  SC_WireLoad *pSVar1;
  char *pcVar2;
  float Area;
  SC_Man *p;
  int nTreeCRatio_local;
  float DUser_local;
  int fDept_local;
  int fUseWireLoads_local;
  Abc_Ntk_t *pNtk_local;
  SC_Lib *pLib_local;
  
  p_00 = Abc_SclManAlloc(pLib,pNtk);
  if (nTreeCRatio != 0) {
    p_00->EstLoadMax = (float)nTreeCRatio * 0.01;
    p_00->EstLinear = 100.0;
  }
  Abc_SclMioGates2SclGates(pLib,pNtk);
  Abc_SclManReadSlewAndLoad(p_00,pNtk);
  if (fUseWireLoads != 0) {
    if (pNtk->pWLoadUsed == (char *)0x0) {
      Area = Abc_SclGetTotalArea(p_00->pNtk);
      pSVar1 = Abc_SclFindWireLoadModel(pLib,Area);
      p_00->pWLoadUsed = pSVar1;
      if (p_00->pWLoadUsed != (SC_WireLoad *)0x0) {
        pcVar2 = Abc_UtilStrsav(p_00->pWLoadUsed->pName);
        pNtk->pWLoadUsed = pcVar2;
      }
    }
    else {
      pSVar1 = Abc_SclFetchWireLoadModel(pLib,pNtk->pWLoadUsed);
      p_00->pWLoadUsed = pSVar1;
    }
  }
  Abc_SclTimeNtkRecompute(p_00,&p_00->SumArea0,&p_00->MaxDelay0,fDept,DUser);
  p_00->SumArea = p_00->SumArea0;
  p_00->MaxDelay = p_00->MaxDelay0;
  return p_00;
}

Assistant:

SC_Man * Abc_SclManStart( SC_Lib * pLib, Abc_Ntk_t * pNtk, int fUseWireLoads, int fDept, float DUser, int nTreeCRatio )
{
    SC_Man * p = Abc_SclManAlloc( pLib, pNtk );
    if ( nTreeCRatio )
    {
        p->EstLoadMax = 0.01 * nTreeCRatio;  // max ratio of Cout/Cave when the estimation is used
        p->EstLinear  = 100;                  // linear coefficient
    }
    Abc_SclMioGates2SclGates( pLib, pNtk );
    Abc_SclManReadSlewAndLoad( p, pNtk );
    if ( fUseWireLoads )
    {
        if ( pNtk->pWLoadUsed == NULL )
        {            
            p->pWLoadUsed = Abc_SclFindWireLoadModel( pLib, Abc_SclGetTotalArea(p->pNtk) );
            if ( p->pWLoadUsed )
            pNtk->pWLoadUsed = Abc_UtilStrsav( p->pWLoadUsed->pName );
        }
        else
            p->pWLoadUsed = Abc_SclFetchWireLoadModel( pLib, pNtk->pWLoadUsed );
    }
    Abc_SclTimeNtkRecompute( p, &p->SumArea0, &p->MaxDelay0, fDept, DUser );
    p->SumArea  = p->SumArea0;
    p->MaxDelay = p->MaxDelay0;
    return p;
}